

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O3

void od_ec_dec_refill(od_ec_dec *dec)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  short sVar5;
  int iVar6;
  bool bVar7;
  
  uVar4 = dec->dif;
  sVar5 = dec->cnt;
  iVar6 = (int)sVar5;
  pbVar1 = dec->end;
  pbVar2 = dec->bptr;
  bVar7 = pbVar2 < pbVar1;
  if (iVar6 < 9 && bVar7) {
    uVar3 = 8 - iVar6;
    do {
      uVar4 = (uint)*pbVar2 << ((byte)uVar3 & 0x1f) ^ uVar4;
      iVar6 = iVar6 + 8;
      sVar5 = (short)iVar6;
      pbVar2 = pbVar2 + 1;
      bVar7 = pbVar2 < pbVar1;
      if (uVar3 < 8) break;
      uVar3 = uVar3 - 8;
    } while (pbVar2 < pbVar1);
  }
  if (!bVar7) {
    dec->tell_offs = (dec->tell_offs - (int)sVar5) + 0x4000;
    sVar5 = 0x4000;
  }
  dec->dif = uVar4;
  dec->cnt = sVar5;
  dec->bptr = pbVar2;
  return;
}

Assistant:

static void od_ec_dec_refill(od_ec_dec *dec) {
  int s;
  od_ec_window dif;
  int16_t cnt;
  const unsigned char *bptr;
  const unsigned char *end;
  dif = dec->dif;
  cnt = dec->cnt;
  bptr = dec->bptr;
  end = dec->end;
  s = OD_EC_WINDOW_SIZE - 9 - (cnt + 15);
  for (; s >= 0 && bptr < end; s -= 8, bptr++) {
    /*Each time a byte is inserted into the window (dif), bptr advances and cnt
       is incremented by 8, so the total number of consumed bits (the return
       value of od_ec_dec_tell) does not change.*/
    assert(s <= OD_EC_WINDOW_SIZE - 8);
    dif ^= (od_ec_window)bptr[0] << s;
    cnt += 8;
  }
  if (bptr >= end) {
    /*We've reached the end of the buffer. It is perfectly valid for us to need
       to fill the window with additional bits past the end of the buffer (and
       this happens in normal operation). These bits should all just be taken
       as zero. But we cannot increment bptr past 'end' (this is undefined
       behavior), so we start to increment dec->tell_offs. We also don't want
       to keep testing bptr against 'end', so we set cnt to OD_EC_LOTS_OF_BITS
       and adjust dec->tell_offs so that the total number of unconsumed bits in
       the window (dec->cnt - dec->tell_offs) does not change. This effectively
       puts lots of zero bits into the window, and means we won't try to refill
       it from the buffer for a very long time (at which point we'll put lots
       of zero bits into the window again).*/
    dec->tell_offs += OD_EC_LOTS_OF_BITS - cnt;
    cnt = OD_EC_LOTS_OF_BITS;
  }
  dec->dif = dif;
  dec->cnt = cnt;
  dec->bptr = bptr;
}